

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromSignExtendedInteger
          (IEEEFloat *this,integerPart *src,uint srcCount,bool isSigned,roundingMode rounding_mode)

{
  int iVar1;
  opStatus oVar2;
  WordType *dst;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,isSigned) != 0) {
    iVar1 = APInt::tcExtractBit(src,srcCount * 0x40 - 1);
    if (iVar1 != 0) {
      this->field_0x12 = this->field_0x12 | 8;
      dst = (WordType *)operator_new__((ulong)srcCount << 3);
      APInt::tcAssign(dst,src,srcCount);
      APInt::tcNegate(dst,srcCount);
      oVar2 = convertFromUnsignedParts(this,dst,srcCount,rounding_mode);
      operator_delete__(dst);
      return oVar2;
    }
  }
  this->field_0x12 = this->field_0x12 & 0xf7;
  oVar2 = convertFromUnsignedParts(this,src,srcCount,rounding_mode);
  return oVar2;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromSignExtendedInteger(const integerPart *src,
                                          unsigned int srcCount, bool isSigned,
                                          roundingMode rounding_mode) {
  opStatus status;

  if (isSigned &&
      APInt::tcExtractBit(src, srcCount * integerPartWidth - 1)) {
    integerPart *copy;

    /* If we're signed and negative negate a copy.  */
    sign = true;
    copy = new integerPart[srcCount];
    APInt::tcAssign(copy, src, srcCount);
    APInt::tcNegate(copy, srcCount);
    status = convertFromUnsignedParts(copy, srcCount, rounding_mode);
    delete [] copy;
  } else {
    sign = false;
    status = convertFromUnsignedParts(src, srcCount, rounding_mode);
  }

  return status;
}